

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,uint32_t psbt_version,Transaction *transaction)

{
  wally_tx *tx_00;
  int iVar1;
  uint32_t version;
  uint32_t locktime;
  CfdException *pCVar2;
  uint64_t satoshi;
  pointer pTVar3;
  pointer pTVar4;
  int ret;
  wally_tx *tx;
  wally_psbt *psbt_pointer;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txout_list;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> txin_list;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_val;
  undefined1 local_140 [56];
  Psbt *local_108;
  TxOutReference *local_100;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  TxInReference txin;
  string tx_hex;
  
  this->_vptr_Psbt = (_func_int **)&PTR__Psbt_005cc848;
  local_108 = this;
  Transaction::Transaction(&this->base_tx_);
  AbstractTransaction::GetHex_abi_cxx11_(&tx_hex,&transaction->super_AbstractTransaction);
  Transaction::GetTxInList(&txin_list,transaction);
  Transaction::GetTxOutList(&txout_list,transaction);
  tx = (wally_tx *)0x0;
  ret = wally_tx_from_hex(tx_hex._M_dataplus._M_p,0,&tx);
  if (ret == 0) {
    if ((tx->num_inputs !=
         ((long)txin_list.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)txin_list.
               super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x90) ||
       (pTVar3 = txin_list.
                 super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       tx->num_outputs !=
       ((long)txout_list.
              super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)txout_list.
             super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x50)) {
      wally_tx_free(tx);
      tx = (wally_tx *)0x0;
      pTVar3 = txin_list.
               super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    txin.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4b24ee;
    txin.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x727;
    txin.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "Psbt";
    logger::warn<int&>((CfdSourceLocation *)&txin,"wally_tx_from_hex NG[{}]",&ret);
    pTVar3 = txin_list.
             super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((txin_list.
         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         txin_list.
         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
         _M_impl.super__Vector_impl_data._M_finish) &&
       (pTVar3 = txin_list.
                 super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       txout_list.
       super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
       _M_impl.super__Vector_impl_data._M_start !=
       txout_list.
       super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
       _M_impl.super__Vector_impl_data._M_finish)) {
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&txin,"psbt tx from hex error.",(allocator *)local_140);
      CfdException::CfdException(pCVar2,kCfdInternalError,(string *)&txin);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  psbt_pointer = (wally_psbt *)0x0;
  ret = wally_psbt_init_alloc
                  (psbt_version,
                   ((long)pTVar3 -
                   (long)txin_list.
                         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x90,
                   ((long)txout_list.
                          super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)txout_list.
                         super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x50,0,&psbt_pointer);
  if (ret != 0) {
    txin.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4b24ee;
    txin.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x739;
    txin.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "Psbt";
    logger::warn<int&>((CfdSourceLocation *)&txin,"wally_psbt_init_alloc NG[{}]",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&txin,"psbt data generate error.",(allocator *)local_140);
    CfdException::CfdException(pCVar2,kCfdInternalError,(string *)&txin);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar1 = 0;
  if (tx == (wally_tx *)0x0) {
    version = AbstractTransaction::GetVersion(&transaction->super_AbstractTransaction);
    locktime = AbstractTransaction::GetLockTime(&transaction->super_AbstractTransaction);
    ret = wally_tx_init_alloc(version,locktime,
                              ((long)txin_list.
                                     super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)txin_list.
                                    super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x90,
                              ((long)txout_list.
                                     super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)txout_list.
                                    super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x50,&tx);
    if (ret != 0) {
      wally_psbt_free(psbt_pointer);
      txin.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4b24ee;
      txin.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x743;
      txin.super_AbstractTxInReference.txid_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "Psbt";
      logger::warn<int&>((CfdSourceLocation *)&txin,"wally_psbt_set_global_tx NG[{}]",&ret);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&txin,"psbt set tx error.",(allocator *)local_140);
      CfdException::CfdException(pCVar2,kCfdInternalError,(string *)&txin);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = 0;
    for (pTVar3 = txin_list.
                  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar3 != txin_list.
                  super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
      TxInReference::TxInReference((TxInReference *)&txin.super_AbstractTxInReference,pTVar3);
      Txid::Txid((Txid *)local_140,&txin.super_AbstractTxInReference.txid_);
      Txid::GetData((ByteData *)&local_f8,(Txid *)local_140);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ,(ByteData *)&local_f8);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
      Txid::~Txid((Txid *)local_140);
      ret = wally_tx_add_raw_input
                      (tx,txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                       (long)txid_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)txid_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                       txin.super_AbstractTxInReference.vout_,
                       txin.super_AbstractTxInReference.sequence_,(uchar *)0x0,0,
                       (wally_tx_witness_stack *)0x0,0);
      if (ret != 0) {
        wally_tx_free(tx);
        wally_psbt_free(psbt_pointer);
        local_140._0_8_ = "cfdcore_psbt.cpp";
        local_140._8_4_ = 0x74f;
        local_140._16_8_ = (long)"MergePsbt" + 5;
        logger::warn<int&>((CfdSourceLocation *)local_140,"wally_tx_add_raw_input NG[{}]",&ret);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_140,"psbt set tx input error.",(allocator *)&local_f8);
        CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_140);
        __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      AbstractTxInReference::~AbstractTxInReference(&txin.super_AbstractTxInReference);
    }
    local_100 = txout_list.
                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    for (pTVar4 = txout_list.
                  super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                  ._M_impl.super__Vector_impl_data._M_start; iVar1 = ret, pTVar4 != local_100;
        pTVar4 = pTVar4 + 1) {
      TxOutReference::TxOutReference((TxOutReference *)&txin,pTVar4);
      Script::Script((Script *)local_140,
                     (Script *)
                     ((long)&txin.super_AbstractTxInReference.txid_.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl + 8));
      Script::GetData((ByteData *)&local_f8,(Script *)local_140);
      ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ,(ByteData *)&local_f8);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
      Script::~Script((Script *)local_140);
      tx_00 = tx;
      local_140._0_8_ =
           CONCAT44(txin.super_AbstractTxInReference.txid_._vptr_Txid._4_4_,
                    txin.super_AbstractTxInReference.txid_._vptr_Txid._0_4_);
      local_140[8] = txin.super_AbstractTxInReference.txid_.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start._0_1_;
      satoshi = Amount::GetSatoshiValue((Amount *)local_140);
      ret = wally_tx_add_raw_output
                      (tx_00,satoshi,
                       txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)txid_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)txid_val.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,0);
      if (ret != 0) {
        wally_tx_free(tx);
        wally_psbt_free(psbt_pointer);
        local_140._0_8_ = "cfdcore_psbt.cpp";
        local_140._8_4_ = 0x75b;
        local_140._16_8_ = (long)"MergePsbt" + 5;
        logger::warn<int&>((CfdSourceLocation *)local_140,"wally_tx_add_raw_output NG[{}]",&ret);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)local_140,"psbt set tx output error.",(allocator *)&local_f8);
        CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_140);
        __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&txid_val.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      AbstractTxOutReference::~AbstractTxOutReference((AbstractTxOutReference *)&txin);
    }
  }
  ret = iVar1;
  ret = wally_psbt_set_global_tx(psbt_pointer,tx);
  wally_tx_free(tx);
  if (ret != 0) {
    wally_psbt_free(psbt_pointer);
    txin.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x4b24ee;
    txin.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x765;
    txin.super_AbstractTxInReference.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "Psbt";
    logger::warn<int&>((CfdSourceLocation *)&txin,"wally_psbt_set_global_tx NG[{}]",&ret);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&txin,"psbt set tx error.",(allocator *)local_140);
    CfdException::CfdException(pCVar2,kCfdInternalError,(string *)&txin);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_108->wally_psbt_pointer_ = psbt_pointer;
  RebuildTransaction((Transaction *)&txin,psbt_pointer);
  Transaction::operator=(&this->base_tx_,(Transaction *)&txin);
  Transaction::~Transaction((Transaction *)&txin);
  ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            (&txout_list);
  ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            (&txin_list);
  ::std::__cxx11::string::~string((string *)&tx_hex);
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const Transaction &transaction) {
  std::string tx_hex = transaction.GetHex();
  auto txin_list = transaction.GetTxInList();
  auto txout_list = transaction.GetTxOutList();
  struct wally_tx *tx = nullptr;
  int ret = wally_tx_from_hex(tx_hex.data(), 0, &tx);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}]", ret);
    if (txin_list.empty() || txout_list.empty()) {
      // fall-through
    } else {
      throw CfdException(kCfdInternalError, "psbt tx from hex error.");
    }
  } else if (
      (tx->num_inputs != txin_list.size()) ||
      (tx->num_outputs != txout_list.size())) {
    // free and direct creating.
    wally_tx_free(tx);
    tx = nullptr;
  }

  struct wally_psbt *psbt_pointer = nullptr;
  ret = wally_psbt_init_alloc(
      psbt_version, txin_list.size(), txout_list.size(), 0, &psbt_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_init_alloc NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt data generate error.");
  }

  if (tx == nullptr) {
    ret = wally_tx_init_alloc(
        transaction.GetVersion(), transaction.GetLockTime(), txin_list.size(),
        txout_list.size(), &tx);
    if (ret != WALLY_OK) {
      wally_psbt_free(psbt_pointer);  // free
      warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt set tx error.");
    }

    for (auto txin : txin_list) {
      auto txid_val = txin.GetTxid().GetData().GetBytes();
      ret = wally_tx_add_raw_input(
          tx, txid_val.data(), txid_val.size(), txin.GetVout(),
          txin.GetSequence(), nullptr, 0, nullptr, 0);
      if (ret != WALLY_OK) {
        wally_tx_free(tx);
        wally_psbt_free(psbt_pointer);  // free
        warn(CFD_LOG_SOURCE, "wally_tx_add_raw_input NG[{}]", ret);
        throw CfdException(kCfdInternalError, "psbt set tx input error.");
      }
    }
    for (auto txout : txout_list) {
      auto script_val = txout.GetLockingScript().GetData().GetBytes();
      ret = wally_tx_add_raw_output(
          tx, static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
          script_val.data(), script_val.size(), 0);
      if (ret != WALLY_OK) {
        wally_tx_free(tx);
        wally_psbt_free(psbt_pointer);  // free
        warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}]", ret);
        throw CfdException(kCfdInternalError, "psbt set tx output error.");
      }
    }
  }

  ret = wally_psbt_set_global_tx(psbt_pointer, tx);
  wally_tx_free(tx);
  if (ret != WALLY_OK) {
    wally_psbt_free(psbt_pointer);  // free
    warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt set tx error.");
  }
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}